

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O2

void __thiscall
Darts::Details::AutoPool<unsigned_int>::resize_buf(AutoPool<unsigned_int> *this,size_t size)

{
  size_t sVar1;
  ulong uVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  AutoArray<char> buf;
  
  sVar5 = size;
  if (size < this->capacity_ * 2) {
    uVar2 = 1;
    do {
      sVar5 = uVar2;
      uVar2 = sVar5 * 2;
    } while (sVar5 < size);
  }
  buf.array_ = (char *)0x0;
  pcVar3 = (char *)operator_new__(sVar5 * 4);
  AutoArray<char>::reset(&buf,pcVar3);
  pcVar3 = (this->buf_).array_;
  sVar1 = this->size_;
  if (sVar1 != 0) {
    for (sVar4 = 0; sVar1 != sVar4; sVar4 = sVar4 + 1) {
      *(undefined4 *)(buf.array_ + sVar4 * 4) = *(undefined4 *)(pcVar3 + sVar4 * 4);
    }
  }
  (this->buf_).array_ = buf.array_;
  this->capacity_ = sVar5;
  buf.array_ = pcVar3;
  AutoArray<char>::clear(&buf);
  return;
}

Assistant:

void AutoPool<T>::resize_buf(std::size_t size) {
  std::size_t capacity;
  if (size >= capacity_ * 2) {
    capacity = size;
  } else {
    capacity = 1;
    while (capacity < size) {
      capacity <<= 1;
    }
  }

  AutoArray<char> buf;
  try {
    buf.reset(new char[sizeof(T) * capacity]);
  } catch (const std::bad_alloc &) {
    DARTS_THROW("failed to resize pool: std::bad_alloc");
  }

  if (size_ > 0) {
    T *src = reinterpret_cast<T *>(&buf_[0]);
    T *dest = reinterpret_cast<T *>(&buf[0]);
    for (std::size_t i = 0; i < size_; ++i) {
      new(&dest[i]) T(src[i]);
      src[i].~T();
    }
  }

  buf_.swap(&buf);
  capacity_ = capacity;
}